

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall
wasm::WasmBinaryWriter::writeExtraDebugLocation
          (WasmBinaryWriter *this,Expression *curr,Function *func,size_t id)

{
  bool bVar1;
  size_type sVar2;
  mapped_type *this_00;
  uint *puVar3;
  size_t id_local;
  Function *func_local;
  Expression *curr_local;
  WasmBinaryWriter *this_local;
  
  if (func != (Function *)0x0) {
    func_local = (Function *)curr;
    curr_local = (Expression *)this;
    bVar1 = std::
            unordered_map<wasm::Expression_*,_wasm::BinaryLocations::Span,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>_>_>
            ::empty(&func->expressionLocations);
    if (!bVar1) {
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
      this_00 = std::
                unordered_map<wasm::Expression_*,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::ZeroInitSmallVector<unsigned_int,_1UL>_>_>_>
                ::operator[](&(this->binaryLocations).delimiters,(key_type *)&func_local);
      puVar3 = ZeroInitSmallVector<unsigned_int,_1UL>::operator[](this_00,id);
      *puVar3 = (uint)sVar2;
    }
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeExtraDebugLocation(Expression* curr,
                                               Function* func,
                                               size_t id) {
  if (func && !func->expressionLocations.empty()) {
    binaryLocations.delimiters[curr][id] = o.size();
  }
}